

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::
list_elem<trompeloeil::side_effect_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
::~list_elem(list_elem<trompeloeil::side_effect_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
             *this)

{
  list_elem<trompeloeil::side_effect_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
  *this_local;
  
  ~list_elem(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

virtual
    ~list_elem()
    {
      unlink();
    }